

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
Session::Session(Session *this,Slot *inSlot,bool inIsReadWrite,CK_VOID_PTR inPApplication,
                CK_NOTIFY inNotify)

{
  Token *pTVar1;
  
  this->_vptr_Session = (_func_int **)&PTR__Session_0019dcf8;
  this->slot = inSlot;
  pTVar1 = Slot::getToken(inSlot);
  this->token = pTVar1;
  this->isReadWrite = inIsReadWrite;
  this->hSession = 0;
  this->pApplication = inPApplication;
  this->notify = inNotify;
  this->operation = 0;
  this->findOp = (FindOperation *)0x0;
  this->digestOp = (HashAlgorithm *)0x0;
  this->hashAlgo = Unknown;
  this->macOp = (MacAlgorithm *)0x0;
  this->asymmetricCryptoOp = (AsymmetricAlgorithm *)0x0;
  *(undefined8 *)((long)&this->asymmetricCryptoOp + 4) = 0;
  *(undefined8 *)((long)&this->symmetricCryptoOp + 4) = 0;
  this->param = (void *)0x0;
  this->paramLen = 0;
  *(undefined4 *)((long)&this->paramLen + 7) = 0;
  this->publicKey = (PublicKey *)0x0;
  this->privateKey = (PrivateKey *)0x0;
  this->symmetricKey = (SymmetricKey *)0x0;
  return;
}

Assistant:

Session::Session(Slot* inSlot, bool inIsReadWrite, CK_VOID_PTR inPApplication, CK_NOTIFY inNotify)
{
	slot = inSlot;
	token = slot->getToken();
	isReadWrite = inIsReadWrite;
	hSession = CK_INVALID_HANDLE;
	pApplication = inPApplication;
	notify = inNotify;
	operation = SESSION_OP_NONE;
	findOp = NULL;
	digestOp = NULL;
	hashAlgo = HashAlgo::Unknown;
	macOp = NULL;
	asymmetricCryptoOp = NULL;
	symmetricCryptoOp = NULL;
	mechanism = AsymMech::Unknown;
	reAuthentication = false;
	allowSinglePartOp = false;
	allowMultiPartOp = false;
	publicKey = NULL;
	privateKey = NULL;
	symmetricKey = NULL;
	param = NULL;
	paramLen = 0;
}